

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void gai_mem_copy(int elemsize,int ndim,void *src_ptr,Integer *src_start,Integer *count,
                 Integer *src_ld,void *dst_ptr,Integer *dst_start,Integer *dst_ld)

{
  Integer IVar1;
  Integer IVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int dst_bvalue [7];
  int src_bvalue [7];
  int dst_stride [7];
  int src_stride [7];
  int dst_bunit [7];
  int src_bunit [7];
  int local_f8 [2];
  undefined1 local_f0 [24];
  int local_d8 [2];
  undefined1 local_d0 [24];
  int local_b8 [8];
  int local_98 [8];
  int local_78 [8];
  int local_58 [10];
  
  uVar10 = (ulong)(uint)ndim;
  if (ndim < 1) {
    lVar11 = 0;
  }
  else {
    uVar5 = 0;
    lVar11 = 0;
    lVar6 = 1;
    do {
      lVar8 = lVar6;
      if ((long)uVar5 < (long)(ndim + -1)) {
        lVar8 = src_ld[uVar5] * lVar6;
      }
      lVar11 = lVar11 + lVar6 * src_start[uVar5];
      uVar5 = uVar5 + 1;
      lVar6 = lVar8;
    } while (uVar10 != uVar5);
  }
  if (ndim < 1) {
    lVar6 = 0;
  }
  else {
    uVar5 = 0;
    lVar6 = 0;
    lVar8 = 1;
    do {
      lVar9 = lVar8;
      if ((long)uVar5 < (long)(ndim + -1)) {
        lVar9 = dst_ld[uVar5] * lVar8;
      }
      lVar6 = lVar6 + lVar8 * dst_start[uVar5];
      uVar5 = uVar5 + 1;
      lVar8 = lVar9;
    } while (uVar10 != uVar5);
  }
  IVar1 = *count;
  local_b8[0] = elemsize;
  local_98[0] = elemsize;
  if (1 < ndim) {
    uVar5 = 0;
    iVar4 = elemsize;
    iVar7 = elemsize;
    do {
      local_98[uVar5 + 1] = iVar7;
      iVar7 = iVar7 * (int)src_ld[uVar5];
      local_98[uVar5 + 1] = iVar7;
      local_b8[uVar5 + 1] = iVar4;
      iVar4 = iVar4 * (int)dst_ld[uVar5];
      local_b8[uVar5 + 1] = iVar4;
      uVar5 = uVar5 + 1;
    } while (ndim - 1 != uVar5);
  }
  iVar4 = 1;
  if (1 < ndim) {
    uVar5 = 1;
    do {
      iVar4 = iVar4 * (int)count[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_58[0] = 1;
  local_58[1] = 1;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_78[0] = 1;
  local_78[1] = 1;
  if (2 < ndim) {
    __n = (ulong)(ndim - 2) << 2;
    lVar8 = 0;
    memset(local_d0,0,__n);
    memset(local_f0,0,__n);
    iVar7 = local_78[1];
    iVar3 = local_58[1];
    do {
      IVar2 = count[lVar8 + 1];
      iVar3 = iVar3 * (int)IVar2;
      local_58[lVar8 + 2] = iVar3;
      iVar7 = iVar7 * (int)IVar2;
      local_78[lVar8 + 2] = iVar7;
      lVar8 = lVar8 + 1;
    } while (uVar10 - 2 != lVar8);
  }
  if (0 < iVar4) {
    iVar7 = 0;
    do {
      if (ndim < 2) {
        lVar8 = 0;
      }
      else {
        uVar5 = 1;
        lVar8 = 0;
        do {
          iVar3 = *(int *)(local_d0 + uVar5 * 4 + -8);
          if ((iVar7 + 1) % local_58[uVar5] == 0) {
            *(int *)(local_d0 + uVar5 * 4 + -8) = iVar3 + 1;
          }
          lVar8 = lVar8 + (long)local_98[uVar5] * (long)iVar3;
          iVar3 = 0;
          if ((long)*(int *)(local_d0 + uVar5 * 4 + -8) < count[uVar5]) {
            iVar3 = *(int *)(local_d0 + uVar5 * 4 + -8);
          }
          *(int *)(local_d0 + uVar5 * 4 + -8) = iVar3;
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      if (ndim < 2) {
        lVar9 = 0;
      }
      else {
        uVar5 = 1;
        lVar9 = 0;
        do {
          iVar3 = *(int *)(local_f0 + uVar5 * 4 + -8);
          if ((iVar7 + 1) % local_78[uVar5] == 0) {
            *(int *)(local_f0 + uVar5 * 4 + -8) = iVar3 + 1;
          }
          lVar9 = lVar9 + (long)local_b8[uVar5] * (long)iVar3;
          iVar3 = 0;
          if ((long)*(int *)(local_f0 + uVar5 * 4 + -8) < count[uVar5]) {
            iVar3 = *(int *)(local_f0 + uVar5 * 4 + -8);
          }
          *(int *)(local_f0 + uVar5 * 4 + -8) = iVar3;
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      memcpy((void *)((long)dst_ptr + lVar9 + lVar6 * elemsize),
             (void *)((long)src_ptr + lVar8 + lVar11 * elemsize),(long)((int)IVar1 * elemsize));
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar4);
  }
  return;
}

Assistant:

void gai_mem_copy(int elemsize, int ndim, void *src_ptr, Integer *src_start,
    Integer *count,  Integer *src_ld, void *dst_ptr, Integer *dst_start,
    Integer *dst_ld)
{
  Integer src_offset, dst_offset;
  Integer factor;
  void *sptr, *dptr;
  int i, j;
  long src_idx, dst_idx;
  int n1dim; /* total number of contiguous segments */
  int src_bvalue[MAXDIM], src_bunit[MAXDIM];
  int dst_bvalue[MAXDIM], dst_bunit[MAXDIM];
  int src_stride[MAXDIM], dst_stride[MAXDIM];
  int segsize;
  /* find offsets for both source and destination buffers and use these to
   * adjust pointers to the first element in each data set
   */
  factor = 1;
  src_offset = 0;
  for (i=0; i<ndim; i++) {
    src_offset += src_start[i]*factor;
    if (i<ndim-1) factor *= src_ld[i];
  }
  sptr = (void*)((char*)src_ptr+src_offset*elemsize);

  factor = 1; //reset the factor

  dst_offset = 0;
  for (i=0; i<ndim; i++) {
    dst_offset += dst_start[i]*factor;
    if (i<ndim-1) factor *= dst_ld[i];
  }
  dptr = (void*)((char*)dst_ptr+dst_offset*elemsize);
  segsize = count[0]*elemsize;
  /* perform the memcpy from source to destination buffer. Start by calculating
   * the total number of contiguous segments in the src array*/
  n1dim = 1;

  src_stride[0] = dst_stride[0] = elemsize;
  for (i=0; i<ndim-1; i++) {
    src_stride[i+1] = src_stride[i];
    src_stride[i+1] *= (int)src_ld[i];
    dst_stride[i+1] = dst_stride[i];
    dst_stride[i+1] *= (int)dst_ld[i];
  }

  for (i=1; i<=ndim-1; i++) {
    n1dim *= count[i];
  }
  /* initialize arrays for evaluating offset of each segment */
  src_bvalue[0] = 0;
  src_bvalue[1] = 0;
  src_bunit[0] = 1;
  src_bunit[1] = 1;
  dst_bvalue[0] = 0;
  dst_bvalue[1] = 0;
  dst_bunit[0] = 1;
  dst_bunit[1] = 1;

  //this part does nothing?
  for (i=2; i<=ndim-1; i++) {
    src_bvalue[i] = 0;
    dst_bvalue[i] = 0;
    src_bunit[i] = src_bunit[i-1]*count[i-1];
    dst_bunit[i] = dst_bunit[i-1]*count[i-1];
  }

  /* evaluate offset for each contiguous segment */
  for (i=0; i<n1dim; i++) {
    src_idx = 0;
    dst_idx = 0;
    for (j=1; j<=ndim-1; j++) {
      src_idx += src_bvalue[j]*src_stride[j];
      if ((i+1)%src_bunit[j] == 0) {
        src_bvalue[j]++;
      }
      if (src_bvalue[j] > (count[j]-1)) {
        src_bvalue[j] = 0;
      }
    }
    for (j=1; j<=ndim-1; j++) {
      dst_idx += dst_bvalue[j]*dst_stride[j];
      if ((i+1)%dst_bunit[j] == 0) {
        dst_bvalue[j]++;
      }
      if (dst_bvalue[j] > (count[j]-1)) {
        dst_bvalue[j] = 0;
      }
    }
    /* copy memory */
    memcpy((char*)dptr+dst_idx,(char*)sptr+src_idx,segsize);
  }
}